

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O1

void udata_getInfo_63(UDataMemory *pData,UDataInfo *pInfo)

{
  uint16_t *__src;
  ushort uVar1;
  DataHeader *pDVar2;
  uint16_t uVar3;
  
  if (pInfo != (UDataInfo *)0x0) {
    if ((pData == (UDataMemory *)0x0) || (pDVar2 = pData->pHeader, pDVar2 == (DataHeader *)0x0)) {
      pInfo->size = 0;
    }
    else {
      uVar3 = udata_getInfoSize_63(&pDVar2->info);
      if (uVar3 < pInfo->size) {
        pInfo->size = uVar3;
      }
      __src = &(pDVar2->info).reservedWord;
      memcpy(&pInfo->reservedWord,__src,(ulong)pInfo->size - 2);
      if ((pDVar2->info).isBigEndian != '\0') {
        uVar1 = *__src;
        pInfo->reservedWord = uVar1 << 8 | uVar1 >> 8;
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_getInfo(UDataMemory *pData, UDataInfo *pInfo) {
    if(pInfo!=NULL) {
        if(pData!=NULL && pData->pHeader!=NULL) {
            const UDataInfo *info=&pData->pHeader->info;
            uint16_t dataInfoSize=udata_getInfoSize(info);
            if(pInfo->size>dataInfoSize) {
                pInfo->size=dataInfoSize;
            }
            uprv_memcpy((uint16_t *)pInfo+1, (const uint16_t *)info+1, pInfo->size-2);
            if(info->isBigEndian!=U_IS_BIG_ENDIAN) {
                /* opposite endianness */
                uint16_t x=info->reservedWord;
                pInfo->reservedWord=(uint16_t)((x<<8)|(x>>8));
            }
        } else {
            pInfo->size=0;
        }
    }
}